

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDFace::HasSharpEdges(ON_SubDFace *this)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_20;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  ON_SubDFace *this_local;
  
  pOStack_20 = this->m_edge4;
  e._6_2_ = 0;
  while( true ) {
    if ((this->m_edge_count <= e._6_2_) ||
       ((e._6_2_ == 4 && (pOStack_20 = this->m_edgex, pOStack_20 == (ON_SubDEdgePtr *)0x0)))) {
      return false;
    }
    this_00 = (ON_SubDEdge *)(pOStack_20->m_ptr & 0xfffffffffffffff8);
    if ((this_00 != (ON_SubDEdge *)0x0) && (bVar1 = ON_SubDEdge::IsSharp(this_00), bVar1)) break;
    e._6_2_ = e._6_2_ + 1;
    pOStack_20 = pOStack_20 + 1;
  }
  return true;
}

Assistant:

bool ON_SubDFace::HasSharpEdges() const
{
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr != e && e->IsSharp())
      return true;
  }
  return false;
}